

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * Appending(string *__return_storage_ptr__,string *FileName)

{
  bool bVar1;
  long local_228;
  ifstream ResultReader;
  string *FileName_local;
  string *Results;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(&local_228,(string *)FileName,_S_in);
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)((long)&local_228 + *(long *)(local_228 + -0x18))), bVar1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_228,(string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string Appending(std::string FileName)
{
    std::string Results;
    std::ifstream ResultReader(FileName);
    while(ResultReader)
    {
        std::getline(ResultReader, Results);
        Results.push_back('\n');
    }
    return Results;
}